

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_list.c
# Opt level: O2

void * qc_list_pophead(QcList *list)

{
  uint *puVar1;
  QcListEntry *__ptr;
  QcListEntry *pQVar2;
  void *pvVar3;
  
  if (list != (QcList *)0x0) {
    __ptr = list->head;
    if (__ptr == (QcListEntry *)0x0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pQVar2 = __ptr->next;
      if (list->cur == __ptr) {
        list->cur = pQVar2;
      }
      list->head = pQVar2;
      if (pQVar2 != (QcListEntry *)0x0) {
        pQVar2->prev = (QcListEntry *)0x0;
      }
      puVar1 = &list->count;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        list->tail = (QcListEntry *)0x0;
      }
      pvVar3 = __ptr->data;
      free(__ptr);
    }
    return pvVar3;
  }
  fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
          ,0x24e);
  __assert_fail("list",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_list.c"
                ,0x24e,"void *qc_list_pophead(QcList *)");
}

Assistant:

void* qc_list_pophead(QcList *list)
{
	QcListEntry	*pop_entry;
	void *pop_data;

    qc_assert(list);

    if(NULL == list->head)
    {
		return NULL;
    }

    pop_entry = list->head;

    if(list->cur == list->head)
    {
        list->cur = list->head->next;
    }

    list->head = list->head->next;
    if(NULL != list->head)
    {
        list->head->prev = NULL;
    }
	
    list->count--;

    if(0 == list->count){
		list->tail = NULL;
	}
    
    pop_data = pop_entry->data;
    qc_free(pop_entry);

    return pop_data;
}